

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

Abc_Cex_t * Fra_SmlGetCounterExample(Fra_Sml_t *p)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Abc_Cex_t *p_00;
  int iVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x41b,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  pAVar1 = p->pAig;
  iVar6 = pAVar1->nRegs;
  uVar3 = pAVar1->nObjs[3] - iVar6;
  if (uVar3 != 0 && iVar6 <= pAVar1->nObjs[3]) {
    uVar8 = pAVar1->vCos->nSize;
    uVar11 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar11;
    }
    do {
      if (uVar11 == uVar7) goto LAB_005dfda5;
      iVar12 = p->nWordsTotal;
      iVar4 = p->nWordsPref;
      lVar5 = (long)iVar4;
      if (iVar4 < iVar12) {
        iVar10 = *(int *)((long)pAVar1->vCos->pArray[uVar11] + 0x24);
        lVar13 = 0;
        do {
          if (*(int *)((long)&p[1].pAig + lVar13 * 4 + (long)(iVar12 * iVar10) * 4 + lVar5 * 4) != 0
             ) {
            lVar13 = 0;
            goto LAB_005dfbce;
          }
          lVar13 = lVar13 + 1;
        } while (iVar12 - iVar4 != (int)lVar13);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar3);
  }
  __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                ,0x42f,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  while (lVar13 = lVar13 + 1, iVar12 - lVar5 != lVar13) {
LAB_005dfbce:
    uVar3 = *(uint *)((long)&p[1].pAig + lVar13 * 4 + (long)(iVar10 * iVar12) * 4 + lVar5 * 4);
    if (uVar3 != 0) {
      iVar4 = iVar4 + (int)lVar13;
      iVar12 = iVar4 / p->nWordsFrame;
      uVar8 = 0;
      goto LAB_005dfbfa;
    }
  }
  iVar12 = -1;
  iVar4 = -1;
  goto LAB_005dfc0d;
  while (uVar8 = uVar8 + 1, uVar8 != 0x20) {
LAB_005dfbfa:
    if ((uVar3 >> (uVar8 & 0x1f) & 1) != 0) goto LAB_005dfc0b;
  }
  uVar8 = 0xffffffff;
LAB_005dfc0b:
  iVar4 = uVar8 + (iVar4 % p->nWordsFrame) * 0x20;
LAB_005dfc0d:
  if (p->nFrames <= iVar12) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x430,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar4) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x431,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar6,pAVar1->nObjs[2] - iVar6,iVar12 + 1);
  p_00->iPo = (int)uVar11;
  p_00->iFrame = iVar12;
  pAVar1 = p->pAig;
  uVar3 = pAVar1->nObjs[2] - pAVar1->nRegs;
  pVVar2 = pAVar1->vCis;
  iVar6 = pVVar2->nSize;
  if ((int)uVar3 < iVar6) {
    uVar7 = (ulong)uVar3;
    do {
      if ((int)uVar3 < 0) {
LAB_005dfda5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(uint *)((long)&p[1].pAig +
                    (long)p->nWordsTotal * (long)*(int *)((long)pVVar2->pArray[uVar7] + 0x24) * 4 +
                    (long)(iVar4 >> 5) * 4) & 1 << ((byte)iVar4 & 0x1f)) != 0) {
        (&p_00[1].iPo)[uVar7 >> 5 & 0x7ffffff] =
             (&p_00[1].iPo)[uVar7 >> 5 & 0x7ffffff] | 1 << ((byte)uVar7 & 0x1f);
        iVar6 = pVVar2->nSize;
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < iVar6);
  }
  if (-1 < iVar12) {
    iVar6 = pAVar1->nRegs;
    iVar10 = pAVar1->nObjs[2];
    iVar9 = 0;
    do {
      if (iVar6 < iVar10) {
        lVar5 = 0;
        do {
          if (pVVar2->nSize <= lVar5) goto LAB_005dfda5;
          if ((*(uint *)((long)&p[1].pAig +
                        (long)(p->nWordsFrame * iVar9 * 0x20 + iVar4 >> 5) * 4 +
                        (long)p->nWordsTotal * (long)*(int *)((long)pVVar2->pArray[lVar5] + 0x24) *
                        4) & 1 << ((byte)iVar4 & 0x1f)) != 0) {
            iVar6 = p_00->nPis * iVar9 + p_00->nRegs + (int)lVar5;
            (&p_00[1].iPo)[iVar6 >> 5] = (&p_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
            iVar6 = pAVar1->nRegs;
            iVar10 = pAVar1->nObjs[2];
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar10 - iVar6);
      }
      bVar14 = iVar9 != iVar12;
      iVar9 = iVar9 + 1;
    } while (bVar14);
  }
  iVar6 = Saig_ManVerifyCex(pAVar1,p_00);
  if (iVar6 == 0) {
    puts("Fra_SmlGetCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Fra_SmlGetCounterExample( Fra_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Aig_ManForEachPoSeq( p->pAig, pObj, iPo )
    {
        if ( Fra_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Fra_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Aig_ManForEachLoSeq( p->pAig, pObj, k )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Aig_ManForEachPiSeq( p->pAig, pObj, k )
        {
            pSims = Fra_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}